

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
to_number_function::evaluate
          (to_number_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  json_type jVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  undefined8 uVar5;
  const_reference pvVar6;
  const_pointer s_00;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this_00
  ;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  chars_to *in_RDI;
  optional<unsigned_long> oVar7;
  type tVar8;
  type tVar9;
  exception *anon_var_0;
  double d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  chars_to to_double;
  type result2;
  int64_t sval;
  type result1;
  uint64_t uval;
  string_view_type sv;
  reference arg0;
  string *in_stack_fffffffffffffe58;
  assertion_error *in_stack_fffffffffffffe60;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe70;
  unsigned_long *in_stack_fffffffffffffe88;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  unsigned_long *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string local_118 [64];
  char *local_d8;
  to_integer_errc local_d0;
  char *local_c8;
  to_integer_errc local_c0;
  undefined8 local_b8;
  char *local_b0;
  to_integer_errc local_a8;
  char *local_a0;
  to_integer_errc local_98;
  undefined8 local_90;
  string_view_type local_88;
  reference local_78;
  undefined1 local_6d;
  _Storage<unsigned_long,_true> local_38;
  undefined1 local_30;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  reference local_8;
  
  local_18 = in_RSI;
  sVar3 = std::
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RSI);
  oVar7 = function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity((function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)in_RDI);
  local_38._M_value =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_30 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4e39ec);
  if (sVar3 == *puVar4) {
    pvVar6 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,0);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            is_value(pvVar6);
    if (bVar1) {
      pvVar6 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](local_18,0);
      local_78 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::value(pvVar6);
      jVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                        (in_stack_fffffffffffffe68);
      if (((byte)(jVar2 - int64_value) < 2) || (jVar2 == double_value)) {
        local_8 = local_78;
      }
      else if (jVar2 == string_value) {
        local_88 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              in_RDI);
        local_90 = 0;
        this_02 = &local_88;
        s_00 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_02);
        std::basic_string_view<char,_std::char_traits<char>_>::length(this_02);
        tVar8 = jsoncons::detail::to_integer<unsigned_long,char>
                          ((char *)in_RDI,(size_t)in_stack_fffffffffffffeb8,
                           in_stack_fffffffffffffeb0);
        local_b0 = tVar8.ptr;
        local_a8 = tVar8.ec;
        local_a0 = local_b0;
        local_98 = local_a8;
        bVar1 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                          ((to_integer_result *)&local_a0);
        if (bVar1) {
          local_8 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::create_json<unsigned_long&>
                              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        else {
          local_b8 = 0;
          this_01 = &local_88;
          this_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
          std::basic_string_view<char,_std::char_traits<char>_>::length(this_01);
          tVar9 = jsoncons::detail::to_integer<long,char>(s_00,(size_t)this_02,(long *)this_00);
          local_d8 = tVar9.ptr;
          local_d0 = tVar9.ec;
          local_c8 = local_d8;
          local_c0 = local_d0;
          bVar1 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                            ((to_integer_result *)&local_c8);
          if (bVar1) {
            local_8 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      ::create_json<long&>(this_00,(long *)this_01);
          }
          else {
            jsoncons::detail::chars_to::chars_to((chars_to *)in_stack_fffffffffffffe70);
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            as_string<std::allocator<char>>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_01);
            std::__cxx11::string::c_str();
            std::__cxx11::string::length();
            jsoncons::detail::chars_to::operator()
                      (in_RDI,in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
            local_8 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      ::create_json<double&>(this_00,(double *)this_01);
            std::__cxx11::string::~string(local_118);
            jsoncons::detail::chars_to::~chars_to((chars_to *)0x4e3e80);
          }
        }
      }
      else {
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::null_value(in_stack_fffffffffffffe70);
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)in_stack_fffffffffffffe70,
                 (jmespath_errc)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::null_value(in_stack_fffffffffffffe70);
    }
    return local_8;
  }
  local_6d = 1;
  uVar5 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (allocator<char> *)in_stack_fffffffffffffe90);
  assertion_error::assertion_error(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_6d = 0;
  __cxa_throw(uVar5,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                switch (arg0.type())
                {
                    case json_type::int64_value:
                    case json_type::uint64_value:
                    case json_type::double_value:
                        return arg0;
                    case json_type::string_value:
                    {
                        auto sv = arg0.as_string_view();
                        uint64_t uval{ 0 };
                        auto result1 = jsoncons::detail::to_integer(sv.data(), sv.length(), uval);
                        if (result1)
                        {
                            return *context.create_json(uval);
                        }
                        int64_t sval{ 0 };
                        auto result2 = jsoncons::detail::to_integer(sv.data(), sv.length(), sval);
                        if (result2)
                        {
                            return *context.create_json(sval);
                        }
                        const jsoncons::detail::chars_to to_double;
                        try
                        {
                            auto s = arg0.as_string();
                            double d = to_double(s.c_str(), s.length());
                            return *context.create_json(d);
                        }
                        catch (const std::exception&)
                        {
                            return context.null_value();
                        }
                    }
                    default:
                        return context.null_value();
                }
            }